

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O0

void ScalarTimesMatrix(double s,Matrix m,Matrix product)

{
  int local_28;
  int local_24;
  int j;
  int i;
  Matrix product_local;
  Matrix m_local;
  double s_local;
  
  if ((*(char *)((long)m + -7) == *(char *)((long)product + -7)) &&
     (*(char *)((long)m + -6) == *(char *)((long)product + -6))) {
    for (local_24 = 0; local_24 < (int)(uint)*(byte *)((long)m + -7); local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < (int)(uint)*(byte *)((long)m + -6); local_28 = local_28 + 1) {
        product[local_24][local_28] = s * m[local_24][local_28];
      }
    }
    return;
  }
  Am_Error("ScalarTimesMatrix");
}

Assistant:

void
ScalarTimesMatrix(double s, Matrix m, Matrix product)
{
  int i, j;

  if (NROWS(m) != NROWS(product) || NCOLS(m) != NCOLS(product))
    Am_Error("ScalarTimesMatrix"); //: result wrong size (%d!=%d)or(%d!=%d)",
  //NROWS(m), NROWS(product),
  //NCOLS(m), NCOLS(product));

  for (i = 0; i < NROWS(m); i++)
    for (j = 0; j < NCOLS(m); j++)
      product[i][j] = s * m[i][j];
}